

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_pri_stack_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  REF_INT RVar5;
  long lVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  REF_INT cell;
  REF_INT local [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    uVar15 = (ulong)uVar4;
    pcVar13 = "create";
    uVar8 = 0x303;
    goto LAB_0011c7a0;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar12 = ref_mpi->id;
  lVar9 = (long)ref_mpi->n;
  iVar7 = 0;
  lVar14 = (long)(int)(0xb / (long)ref_mpi->n);
  lVar11 = lVar14 * lVar9;
  if (0xb < lVar11) {
    iVar7 = ((int)((((lVar9 + 0xb) / lVar9) * (lVar11 + -0xc)) / lVar14) - (int)lVar11) + 0xc;
  }
  if (iVar12 == iVar7) {
LAB_0011ab14:
    uVar4 = ref_node_add(ref_node,0,local);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x319;
      goto LAB_0011c7a0;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,1,local + 1);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x31a;
      goto LAB_0011c7a0;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,2,local + 2);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x31b;
      goto LAB_0011c7a0;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,3,local + 3);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x31c;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,4,local + 4);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x31d;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[4];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[4] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,5,local + 5);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x31e;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[5];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar11 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[5] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_cell_add(pRVar1->cell[10],local,&cell);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add prism";
      uVar8 = 800;
      goto LAB_0011c7a0;
    }
    iVar12 = ref_mpi->id;
    lVar11 = (long)ref_mpi->n;
    lVar9 = (lVar11 + 0xb) / lVar11;
    lVar14 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar11 = 0xc - lVar11 * lVar14;
  }
  else {
    lVar9 = (lVar9 + 0xb) / lVar9;
    lVar6 = 0;
    if (lVar9 + 1U < 3) {
      lVar6 = lVar9;
    }
    lVar11 = 0xc - lVar11;
    if (lVar11 <= lVar6) {
      lVar6 = (1 - lVar9 * lVar11) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011ab14;
    lVar6 = SUB168(ZEXT816(2) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (2 - lVar9 * lVar11) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011ab14;
    lVar6 = SUB168(ZEXT816(3) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (3 - lVar9 * lVar11) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011ab14;
    lVar6 = SUB168(ZEXT816(4) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (4 - lVar9 * lVar11) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011ab14;
    lVar6 = SUB168(ZEXT816(5) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (5 - lVar9 * lVar11) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011ab14;
  }
  lVar6 = SUB168(ZEXT816(3) / SEXT816(lVar9),0);
  if (lVar11 <= lVar6) {
    lVar6 = (3 - lVar11 * lVar9) / lVar14 + lVar11;
  }
  if (iVar12 == (int)lVar6) {
LAB_0011b2d2:
    uVar4 = ref_node_add(ref_node,3,local);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x335;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,4,local + 1);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x336;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,5,local + 2);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x337;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar11 * 0xf + 2] = 1.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,6,local + 3);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x338;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 2.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,7,local + 4);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x339;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[4];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 2.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[4] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,8,local + 5);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x33a;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[5];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar11 * 0xf + 2] = 2.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[5] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_cell_add(pRVar1->cell[10],local,&cell);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add prism";
      uVar8 = 0x33c;
      goto LAB_0011c7a0;
    }
    iVar12 = ref_mpi->id;
    lVar11 = (long)ref_mpi->n;
    lVar9 = (lVar11 + 0xb) / lVar11;
    lVar10 = SUB168(ZEXT816(6) / SEXT816(lVar9),0);
    lVar14 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar11 = 0xc - lVar11 * lVar14;
  }
  else {
    lVar6 = SUB168(ZEXT816(4) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (4 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011b2d2;
    lVar6 = SUB168(ZEXT816(5) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (5 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011b2d2;
    lVar10 = SUB168(ZEXT816(6) / SEXT816(lVar9),0);
    lVar6 = lVar10;
    if (lVar11 <= lVar10) {
      lVar6 = (6 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011b2d2;
    lVar6 = SUB168(ZEXT816(7) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (7 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011b2d2;
    lVar6 = SUB168(ZEXT816(8) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (8 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011b2d2;
  }
  if (lVar11 <= lVar10) {
    lVar10 = (6 - lVar11 * lVar9) / lVar14 + lVar11;
  }
  if (iVar12 == (int)lVar10) {
LAB_0011baa1:
    uVar4 = ref_node_add(ref_node,6,local);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x351;
      goto LAB_0011c7a0;
    }
    lVar9 = -1;
    pRVar3 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 2.0;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,7,local + 1);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x352;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 2.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,8,local + 2);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x353;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar11 * 0xf + 2] = 2.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,9,local + 3);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x354;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[3];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 3.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,10,local + 4);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x355;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[4];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *pRVar2 = 1.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar11 * 0xf + 2] = 3.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[4] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[4]) && (local[4] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_node_add(ref_node,0xb,local + 5);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add node";
      uVar8 = 0x356;
      goto LAB_0011c7a0;
    }
    pRVar3 = ref_node->real;
    lVar11 = (long)local[5];
    pRVar2 = pRVar3 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    pRVar3[lVar11 * 0xf + 2] = 3.0;
    lVar9 = -1;
    if (((-1 < lVar11) && (local[5] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar9 = ref_node->global[lVar11];
    }
    iVar12 = ref_mpi->n;
    lVar6 = (long)iVar12;
    lVar14 = (lVar6 + 0xb) / lVar6;
    if ((long)(0xb % (long)iVar12 & 0xffffffffU) < lVar9 / lVar14) {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      lVar10 = (long)(int)(0xb / (long)iVar12);
      lVar6 = 0xc - lVar6 * lVar10;
      RVar5 = (int)((lVar9 - lVar14 * lVar6) / lVar10) + (int)lVar6;
    }
    else {
      lVar9 = -1;
      if ((-1 < local[5]) && (local[5] < ref_node->max)) {
        lVar9 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar9 = ref_node->global[lVar11];
        }
      }
      RVar5 = (REF_INT)(lVar9 / lVar14);
    }
    ref_node->part[lVar11] = RVar5;
    uVar4 = ref_cell_add(pRVar1->cell[10],local,&cell);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add prism";
      uVar8 = 0x358;
      goto LAB_0011c7a0;
    }
  }
  else {
    lVar6 = SUB168(ZEXT816(7) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (7 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011baa1;
    lVar6 = SUB168(ZEXT816(8) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (8 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011baa1;
    lVar6 = SUB168(ZEXT816(9) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (9 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011baa1;
    lVar6 = SUB168(ZEXT816(10) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (10 - lVar11 * lVar9) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011baa1;
    lVar6 = SUB168(ZEXT816(0xb) / SEXT816(lVar9),0);
    if (lVar11 <= lVar6) {
      lVar6 = (0xb - lVar9 * lVar11) / lVar14 + lVar11;
    }
    if (iVar12 == (int)lVar6) goto LAB_0011baa1;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,0xc);
  if (uVar4 != 0) {
    uVar15 = (ulong)uVar4;
    pcVar13 = "glob";
    uVar8 = 0x35b;
    goto LAB_0011c7a0;
  }
  iVar12 = ref_mpi->id;
  lVar14 = (long)ref_mpi->n;
  lVar11 = (lVar14 + 0xb) / lVar14;
  lVar9 = 0;
  if (lVar11 + 1U < 3) {
    lVar9 = lVar11;
  }
  lVar6 = (long)(int)(0xb / (long)ref_mpi->n);
  lVar14 = lVar14 * lVar6;
  lVar10 = 0xc - lVar14;
  if (lVar10 <= lVar9) {
    lVar9 = (1 - lVar10 * lVar11) / lVar6 + lVar10;
  }
  if (iVar12 == (int)lVar9) {
LAB_0011c247:
    uVar4 = ref_node_local(ref_node,1,local);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x36a;
      goto LAB_0011c7a0;
    }
    uVar4 = ref_node_local(ref_node,0,local + 1);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x36b;
      goto LAB_0011c7a0;
    }
    uVar4 = ref_node_local(ref_node,3,local + 2);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x36c;
      goto LAB_0011c7a0;
    }
    uVar4 = ref_node_local(ref_node,4,local + 3);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x36d;
      goto LAB_0011c7a0;
    }
    local[4] = 0x14;
    uVar4 = ref_cell_add(pRVar1->cell[6],local,&cell);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add quad";
      uVar8 = 0x36f;
      goto LAB_0011c7a0;
    }
    iVar12 = ref_mpi->id;
    lVar9 = (long)ref_mpi->n;
    lVar11 = (lVar9 + 0xb) / lVar9;
    lVar6 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar10 = 0xc - lVar9 * lVar6;
  }
  else {
    iVar7 = 0;
    if (0xb < lVar14) {
      iVar7 = ((int)(((lVar14 + -0xc) * lVar11) / lVar6) - (int)lVar14) + 0xc;
    }
    if (iVar12 == iVar7) goto LAB_0011c247;
    lVar9 = SUB168(ZEXT816(3) / SEXT816(lVar11),0);
    if (lVar10 <= lVar9) {
      lVar9 = (3 - lVar10 * lVar11) / lVar6 + lVar10;
    }
    if (iVar12 == (int)lVar9) goto LAB_0011c247;
    lVar9 = SUB168(ZEXT816(4) / SEXT816(lVar11),0);
    if (lVar10 <= lVar9) {
      lVar9 = (4 - lVar11 * lVar10) / lVar6 + lVar10;
    }
    if (iVar12 == (int)lVar9) goto LAB_0011c247;
  }
  lVar9 = SUB168(ZEXT816(4) / SEXT816(lVar11),0);
  if (lVar10 <= lVar9) {
    lVar9 = (4 - lVar10 * lVar11) / lVar6 + lVar10;
  }
  if (iVar12 == (int)lVar9) {
LAB_0011c45b:
    uVar4 = ref_node_local(ref_node,4,local);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x37f;
      goto LAB_0011c7a0;
    }
    uVar4 = ref_node_local(ref_node,3,local + 1);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x380;
      goto LAB_0011c7a0;
    }
    uVar4 = ref_node_local(ref_node,6,local + 2);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x381;
      goto LAB_0011c7a0;
    }
    uVar4 = ref_node_local(ref_node,7,local + 3);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x382;
      goto LAB_0011c7a0;
    }
    local[4] = 0x14;
    uVar4 = ref_cell_add(pRVar1->cell[6],local,&cell);
    if (uVar4 != 0) {
      uVar15 = (ulong)uVar4;
      pcVar13 = "add quad";
      uVar8 = 900;
      goto LAB_0011c7a0;
    }
    iVar12 = ref_mpi->id;
    lVar9 = (long)ref_mpi->n;
    lVar11 = (lVar9 + 0xb) / lVar9;
    lVar14 = SUB168(ZEXT816(7) / SEXT816(lVar11),0);
    lVar6 = (long)(int)(0xb / (long)ref_mpi->n);
    lVar10 = 0xc - lVar9 * lVar6;
  }
  else {
    lVar9 = SUB168(ZEXT816(3) / SEXT816(lVar11),0);
    if (lVar10 <= lVar9) {
      lVar9 = (3 - lVar10 * lVar11) / lVar6 + lVar10;
    }
    if (iVar12 == (int)lVar9) goto LAB_0011c45b;
    lVar9 = SUB168(ZEXT816(6) / SEXT816(lVar11),0);
    if (lVar10 <= lVar9) {
      lVar9 = (6 - lVar10 * lVar11) / lVar6 + lVar10;
    }
    if (iVar12 == (int)lVar9) goto LAB_0011c45b;
    lVar14 = SUB168(ZEXT816(7) / SEXT816(lVar11),0);
    lVar9 = lVar14;
    if (lVar10 <= lVar14) {
      lVar9 = (7 - lVar10 * lVar11) / lVar6 + lVar10;
    }
    if (iVar12 == (int)lVar9) goto LAB_0011c45b;
  }
  if (lVar10 <= lVar14) {
    lVar14 = (7 - lVar10 * lVar11) / lVar6 + lVar10;
  }
  if (iVar12 != (int)lVar14) {
    lVar9 = SUB168(ZEXT816(6) / SEXT816(lVar11),0);
    if (lVar10 <= lVar9) {
      lVar9 = (6 - lVar10 * lVar11) / lVar6 + lVar10;
    }
    if (iVar12 != (int)lVar9) {
      lVar9 = SUB168(ZEXT816(9) / SEXT816(lVar11),0);
      if (lVar10 <= lVar9) {
        lVar9 = (9 - lVar10 * lVar11) / lVar6 + lVar10;
      }
      if (iVar12 != (int)lVar9) {
        lVar9 = SUB168(ZEXT816(10) / SEXT816(lVar11),0);
        if (lVar10 <= lVar9) {
          lVar9 = (10 - lVar11 * lVar10) / lVar6 + lVar10;
        }
        if (iVar12 != (int)lVar9) {
          return 0;
        }
      }
    }
  }
  uVar4 = ref_node_local(ref_node,7,local);
  if (uVar4 == 0) {
    uVar4 = ref_node_local(ref_node,6,local + 1);
    if (uVar4 == 0) {
      uVar4 = ref_node_local(ref_node,9,local + 2);
      if (uVar4 == 0) {
        uVar4 = ref_node_local(ref_node,10,local + 3);
        if (uVar4 == 0) {
          local[4] = 0x14;
          uVar4 = ref_cell_add(pRVar1->cell[6],local,&cell);
          if (uVar4 == 0) {
            return 0;
          }
          uVar15 = (ulong)uVar4;
          pcVar13 = "add quad";
          uVar8 = 0x399;
        }
        else {
          uVar15 = (ulong)uVar4;
          pcVar13 = "loc";
          uVar8 = 0x397;
        }
      }
      else {
        uVar15 = (ulong)uVar4;
        pcVar13 = "loc";
        uVar8 = 0x396;
      }
    }
    else {
      uVar15 = (ulong)uVar4;
      pcVar13 = "loc";
      uVar8 = 0x395;
    }
  }
  else {
    uVar15 = (ulong)uVar4;
    pcVar13 = "loc";
    uVar8 = 0x394;
  }
LAB_0011c7a0:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_pri_stack_grid",uVar15,pcVar13);
  return (REF_STATUS)uVar15;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_stack_grid(REF_GRID *ref_grid_ptr,
                                              REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_GLOB global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_GLOB nnodesg = 12;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;
  global[4] = 4;
  global[5] = 5;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);
    add_that_node(4, 1.0, 0.0, 1.0);
    add_that_node(5, 0.0, 1.0, 1.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 3;
  global[1] = 4;
  global[2] = 5;
  global[3] = 6;
  global[4] = 7;
  global[5] = 8;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 1.0);
    add_that_node(1, 1.0, 0.0, 1.0);
    add_that_node(2, 0.0, 1.0, 1.0);
    add_that_node(3, 0.0, 0.0, 2.0);
    add_that_node(4, 1.0, 0.0, 2.0);
    add_that_node(5, 0.0, 1.0, 2.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  global[0] = 6;
  global[1] = 7;
  global[2] = 8;
  global[3] = 9;
  global[4] = 10;
  global[5] = 11;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[4]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[5])) {
    add_that_node(0, 0.0, 0.0, 2.0);
    add_that_node(1, 1.0, 0.0, 2.0);
    add_that_node(2, 0.0, 1.0, 2.0);
    add_that_node(3, 0.0, 0.0, 3.0);
    add_that_node(4, 1.0, 0.0, 3.0);
    add_that_node(5, 0.0, 1.0, 3.0);

    RSS(ref_cell_add(ref_grid_pri(ref_grid), local, &cell), "add prism");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "glob");

  global[0] = 1;
  global[1] = 0;
  global[2] = 3;
  global[3] = 4;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 4;
  global[1] = 3;
  global[2] = 6;
  global[3] = 7;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  global[0] = 7;
  global[1] = 6;
  global[2] = 9;
  global[3] = 10;
  global[4] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    RSS(ref_node_local(ref_node, global[3], &(local[3])), "loc");
    local[4] = (REF_INT)global[4];
    RSS(ref_cell_add(ref_grid_qua(ref_grid), local, &cell), "add quad");
  }

  return REF_SUCCESS;
}